

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
* __thiscall
Hero::getSprite(vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                *__return_storage_ptr__,Hero *this)

{
  initializer_list<int> __l;
  initializer_list<std::vector<int,_std::allocator<int>_>_> __l_00;
  allocator_type local_36;
  allocator_type local_35;
  int local_34;
  _Vector_base<int,_std::allocator<int>_> local_30;
  
  local_34 = 2;
  __l._M_len = 1;
  __l._M_array = &local_34;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_30,__l,&local_35);
  __l_00._M_len = 1;
  __l_00._M_array = (iterator)&local_30;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector(__return_storage_ptr__,__l_00,&local_36);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_30);
  return __return_storage_ptr__;
}

Assistant:

vvi getSprite() const { return {{character}}; }